

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O1

keypress inkey(void)

{
  ui_event_type uVar1;
  uint uVar2;
  mouseclick mVar3;
  uint uVar4;
  undefined4 in_EDX;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ui_event uVar9;
  keypress kVar10;
  
  mVar3.type = EVT_NONE;
  mVar3.x = '\0';
  mVar3.y = '\0';
  mVar3.button = '\0';
  mVar3.mods = '\0';
  uVar6 = 0;
  uVar8 = 0;
  uVar4 = 0;
  do {
    uVar1 = mVar3.type;
    if ((int)uVar1 < 8) {
      if (uVar1 == EVT_KBRD) {
LAB_001d13d9:
        uVar5 = 1;
        if (uVar1 != EVT_BUTTON) {
          uVar5 = (ulong)mVar3 & 0xffffffff;
        }
        uVar7 = ((uint)uVar8 & 0xff) << 0x10;
        uVar2 = (uint)(ushort)uVar6;
        goto LAB_001d1416;
      }
      if (uVar1 == EVT_MOUSE) {
        uVar2 = 0xe000;
        if ((char)uVar8 == '\x01') {
          uVar2 = 10;
        }
LAB_001d140a:
        uVar5 = 1;
        in_EDX = 0;
        uVar7 = 0;
        uVar4 = 0;
LAB_001d1416:
        kVar10._0_8_ = (ulong)(uVar2 | uVar4 | uVar7) << 0x20 | uVar5;
        kVar10._8_4_ = in_EDX;
        return kVar10;
      }
    }
    else {
      if (uVar1 == EVT_BUTTON) goto LAB_001d13d9;
      if (uVar1 == EVT_ESCAPE) {
        uVar2 = 0xe000;
        goto LAB_001d140a;
      }
    }
    uVar9 = inkey_ex();
    in_EDX = uVar9._8_4_;
    mVar3 = uVar9.mouse;
    uVar6 = (ulong)mVar3 >> 0x20;
    uVar8 = (ulong)mVar3 >> 0x30;
    uVar4 = uVar9.key.code & 0xff000000;
  } while( true );
}

Assistant:

struct keypress inkey(void)
{
	ui_event ke = EVENT_EMPTY;

	while (ke.type != EVT_ESCAPE && ke.type != EVT_KBRD &&
		   ke.type != EVT_MOUSE && ke.type != EVT_BUTTON)
		ke = inkey_ex();

	/* Make the event a keypress */
	if (ke.type == EVT_ESCAPE) {
		ke.type = EVT_KBRD;
		ke.key.code = ESCAPE;
		ke.key.mods = 0;
	} else if (ke.type == EVT_MOUSE) {
		if (ke.mouse.button == 1) {
			ke.type = EVT_KBRD;
			ke.key.code = '\n';
			ke.key.mods = 0;
		} else {
			ke.type = EVT_KBRD;
			ke.key.code = ESCAPE;
			ke.key.mods = 0;
		}
	} else if (ke.type == EVT_BUTTON) {
		ke.type = EVT_KBRD;
	}

	return ke.key;
}